

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

void __thiscall
jsonnet::internal::(anonymous_namespace)::Stack::
newFrame<jsonnet::internal::(anonymous_namespace)::FrameKind,jsonnet::internal::AST_const*>
          (Stack *this,FrameKind args,AST *args_1)

{
  pointer __first;
  pointer __last;
  pointer __result;
  pointer pFVar1;
  pointer pFVar2;
  _Tp_alloc_type *in_RCX;
  undefined4 in_register_00000034;
  size_t __n;
  undefined1 local_44 [12];
  AST *local_38;
  
  __n = CONCAT44(in_register_00000034,args);
  pFVar2 = *(pointer *)(this + 0x18);
  local_44._0_4_ = args;
  local_38 = args_1;
  if (pFVar2 == *(pointer *)(this + 0x20)) {
    local_44._4_8_ =
         std::
         vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
         ::_M_check_len((vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                         *)(this + 0x10),__n,(char *)args_1);
    __first = *(pointer *)(this + 0x10);
    __last = *(pointer *)(this + 0x18);
    __result = std::
               _Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
               ::_M_allocate((_Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                              *)local_44._4_8_,__n);
    std::allocator_traits<std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>>::
    construct<jsonnet::internal::(anonymous_namespace)::Frame,jsonnet::internal::(anonymous_namespace)::FrameKind&,jsonnet::internal::AST_const*&>
              ((allocator_type *)(((long)pFVar2 - (long)__first) + (long)__result),(Frame *)local_44
               ,(FrameKind *)&local_38,(AST **)in_RCX);
    pFVar1 = std::
             vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
             ::_S_relocate(__first,pFVar2,__result,in_RCX);
    pFVar2 = std::
             vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
             ::_S_relocate(pFVar2,__last,pFVar1 + 1,in_RCX);
    if (__first != (pointer)0x0) {
      operator_delete(__first,*(long *)(this + 0x20) - (long)__first);
    }
    *(pointer *)(this + 0x10) = __result;
    *(pointer *)(this + 0x18) = pFVar2;
    *(pointer *)(this + 0x20) = __result + local_44._4_8_;
  }
  else {
    std::allocator_traits<std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>>::
    construct<jsonnet::internal::(anonymous_namespace)::Frame,jsonnet::internal::(anonymous_namespace)::FrameKind&,jsonnet::internal::AST_const*&>
              ((allocator_type *)pFVar2,(Frame *)local_44,(FrameKind *)&local_38,(AST **)in_RCX);
    *(long *)(this + 0x18) = *(long *)(this + 0x18) + 400;
  }
  return;
}

Assistant:

void newFrame(Args... args)
    {
        stack.emplace_back(args...);
    }